

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_manager.cpp
# Opt level: O1

InvalidInputException *
duckdb::ErrorManager::InvalidUnicodeError
          (InvalidInputException *__return_storage_ptr__,string *input,string *context)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  UnicodeType UVar2;
  long *plVar3;
  char *pcVar4;
  size_type *psVar5;
  UnicodeInvalidReason reason;
  string base_message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  size_t pos;
  UnicodeInvalidReason local_8c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  string local_48;
  size_t local_28;
  
  UVar2 = Utf8Proc::Analyze((input->_M_dataplus)._M_p,input->_M_string_length,&local_8c,&local_28);
  if (UVar2 != INVALID) {
    ::std::operator+(&local_88,"Invalid unicode error thrown but no invalid unicode detected in ",
                     context);
    InvalidInputException::InvalidInputException(__return_storage_ptr__,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p == &local_88.field_2) {
      return __return_storage_ptr__;
    }
    goto LAB_004db2bd;
  }
  paVar1 = &local_88.field_2;
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  local_88._M_dataplus._M_p = (pointer)paVar1;
  if (local_8c == INVALID_UNICODE) {
    pcVar4 = "Invalid unicode";
LAB_004db30f:
    ::std::__cxx11::string::_M_replace((ulong)&local_88,0,(char *)0x0,(ulong)pcVar4);
  }
  else if (local_8c == BYTE_MISMATCH) {
    pcVar4 = "Invalid unicode (byte sequence mismatch)";
    goto LAB_004db30f;
  }
  local_68[0] = local_58;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_68,local_88._M_dataplus._M_p,
             local_88._M_dataplus._M_p + local_88._M_string_length);
  ::std::__cxx11::string::append((char *)local_68);
  plVar3 = (long *)::std::__cxx11::string::_M_append
                             ((char *)local_68,(ulong)(context->_M_dataplus)._M_p);
  psVar5 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_48.field_2._M_allocated_capacity = *psVar5;
    local_48.field_2._8_8_ = plVar3[3];
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  }
  else {
    local_48.field_2._M_allocated_capacity = *psVar5;
    local_48._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_48._M_string_length = plVar3[1];
  *plVar3 = (long)psVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  InvalidInputException::InvalidInputException(__return_storage_ptr__,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p == paVar1) {
    return __return_storage_ptr__;
  }
LAB_004db2bd:
  operator_delete(local_88._M_dataplus._M_p);
  return __return_storage_ptr__;
}

Assistant:

InvalidInputException ErrorManager::InvalidUnicodeError(const string &input, const string &context) {
	UnicodeInvalidReason reason;
	size_t pos;
	auto unicode = Utf8Proc::Analyze(const_char_ptr_cast(input.c_str()), input.size(), &reason, &pos);
	if (unicode != UnicodeType::INVALID) {
		return InvalidInputException("Invalid unicode error thrown but no invalid unicode detected in " + context);
	}
	string base_message;
	switch (reason) {
	case UnicodeInvalidReason::BYTE_MISMATCH:
		base_message = "Invalid unicode (byte sequence mismatch)";
		break;
	case UnicodeInvalidReason::INVALID_UNICODE:
		base_message = "Invalid unicode";
		break;
	default:
		break;
	}
	return InvalidInputException(base_message + " detected in " + context);
}